

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::BeginLoopFixedGroupLastIterationInst::Exec
          (BeginLoopFixedGroupLastIterationInst *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  int iVar1;
  Type TVar2;
  PageAllocation *pPVar3;
  size_t sVar4;
  uint8 *puVar5;
  Program *pPVar6;
  uint8 *puVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  ArenaAllocator *alloc;
  LoopInfo *pLVar11;
  
  iVar1 = (this->super_GroupMixin).groupId;
  if (((long)iVar1 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar9) goto LAB_00f0de68;
    *puVar10 = 0;
  }
  if ((matcher->groupInfos).ptr[iVar1].length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xde7,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar9) goto LAB_00f0de68;
    *puVar10 = 0;
  }
  iVar1 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
  if (((long)iVar1 < 0) || (((matcher->program).ptr)->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar9) goto LAB_00f0de68;
    *puVar10 = 0;
  }
  pLVar11 = (matcher->loopInfos).ptr + iVar1;
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.hasOuterLoops == true) {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar9) goto LAB_00f0de68;
      *puVar10 = 0;
    }
    pPVar3 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar4 + 0x28;
    *(size_t *)((long)&pPVar3[1].pageCount + sVar4) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    iVar1 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
    *(undefined1 *)((long)&pPVar3[2].pageCount + sVar4) = 1;
    *(undefined ***)((long)&pPVar3[1].segment + sVar4) = &PTR_Print_01559968;
    *(int *)((long)&pPVar3[2].pageCount + sVar4 + 4) = iVar1;
    *(CharCount *)((long)&pPVar3[2].segment + sVar4) = pLVar11->number;
    *(CharCount *)((long)&pPVar3[2].segment + sVar4 + 4) = pLVar11->startInputOffset;
    *(undefined8 *)((long)&pPVar3[3].pageCount + sVar4) = 0;
    if (pLVar11->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014ea098;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar3[3].pageCount + sVar4) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar11->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x18) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar9) goto LAB_00f0de68;
      *puVar10 = 0;
    }
    pPVar3 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar4 + 0x18;
    *(size_t *)((long)&pPVar3[1].pageCount + sVar4) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x18;
    iVar1 = (this->super_GroupMixin).groupId;
    *(undefined1 *)((long)&pPVar3[2].pageCount + sVar4) = 3;
    *(undefined ***)((long)&pPVar3[1].segment + sVar4) = &PTR_Print_015597e8;
    *(int *)((long)&pPVar3[2].pageCount + sVar4 + 4) = iVar1;
    Matcher::PushStats(matcher,contStack,input);
  }
  pLVar11->number = 0;
  pLVar11->startInputOffset = *inputOffset;
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
    if ((BeginLoopFixedGroupLastIterationInst *)*instPointer != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xe06,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
      if (!bVar9) goto LAB_00f0de68;
      *puVar10 = 0;
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x20) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar9) goto LAB_00f0de68;
      *puVar10 = 0;
    }
    pPVar3 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar4 + 0x20;
    *(size_t *)((long)&pPVar3[1].pageCount + sVar4) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x20;
    puVar5 = *instPointer;
    pPVar6 = (matcher->program).ptr;
    puVar7 = *(uint8 **)&pPVar6->rep;
    if ((puVar5 < puVar7) || (puVar7 + (pPVar6->rep).insts.instsLen <= puVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x767,
                         "(inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen)"
                         ,
                         "inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen"
                        );
      if (!bVar9) {
LAB_00f0de68:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar10 = 0;
    }
    TVar2 = (((matcher->program).ptr)->rep).boiLiteral2.literal;
    *(undefined1 *)((long)&pPVar3[2].pageCount + sVar4) = 10;
    *(undefined ***)((long)&pPVar3[1].segment + sVar4) = &PTR_Print_01559938;
    *(Type *)((long)&pPVar3[2].pageCount + sVar4 + 4) = (int)puVar5 - TVar2;
    *(undefined1 *)((long)&pPVar3[2].segment + sVar4) = 1;
    Matcher::PushStats(matcher,contStack,input);
  }
  *instPointer = *instPointer + 0x1c;
  return false;
}

Assistant:

inline bool BeginLoopFixedGroupLastIterationInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop is contained in an outer loop, continuation stack may already have a RewindLoopFixedGroupLastIteration entry
        // for this loop. We must make sure it's state is preserved on backtrack.
        if (hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // If loop is contained in an outer loop or assertion, we must reset the group binding if we backtrack all the way out
        if (!noNeedToSave)
        {
            PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // startInputOffset will stay here for all iterations, and we'll use number of length to figure out
        // where in the input to rewind to
        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        if (repeats.lower == 0)
        {
            // CHOICEPOINT: Try one iteration of body. Failure of body will rewind input to here and resume with follow.
            Assert(instPointer == (uint8*)this);
            PUSH(contStack, RewindLoopFixedGroupLastIterationCont, matcher.InstPointerToLabel(instPointer), true);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        // else: Must match minimum iterations, so continue to loop body. Failure of body signals failure of entire loop.

        instPointer += sizeof(*this);
        return false;
    }